

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# non_linear_least_squares.cpp
# Opt level: O3

int __thiscall
SubstrateConcentrationFunctor::operator()
          (SubstrateConcentrationFunctor *this,VectorXd *z,VectorXd *r)

{
  double *pdVar1;
  double dVar2;
  ulong uVar3;
  double *pdVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  char *__function;
  uint uVar8;
  ulong uVar9;
  
  uVar3 = (this->Points).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  if ((long)uVar3 < 1) {
    return 0;
  }
  pdVar4 = (this->Points).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data;
  lVar5 = (this->Points).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  if (pdVar4 == (double *)0x0 || -1 < lVar5) {
    if (lVar5 < 2) {
      __function = 
      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>, 0>::operator()(Index) const [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
      ;
    }
    else {
      lVar5 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      if ((0 < lVar5) && (lVar5 != 1)) {
        pdVar6 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        pdVar7 = (r->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        lVar5 = (r->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        ;
        uVar8 = 1;
        uVar9 = 0;
        do {
          if (lVar5 <= (long)uVar9) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          pdVar1 = pdVar4 + uVar9;
          dVar2 = *pdVar1;
          pdVar7[uVar9] = pdVar1[uVar3] - (*pdVar6 * dVar2) / (dVar2 + pdVar6[1]);
          uVar9 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
        } while (uVar9 < uVar3);
        return 0;
      }
      __function = 
      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
      ;
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,__function);
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
               );
}

Assistant:

int operator()(const Eigen::VectorXd &z, Eigen::VectorXd &r) const
    {
        double x_i,y_i,beta1,beta2;
        for(unsigned int i = 0; i < this->Points.rows(); ++i)
        {
            y_i=this->Points.row(i)(1);
            x_i=this->Points.row(i)(0);
            beta1=z(0);
            beta2=z(1);
            r(i) =y_i-(beta1*x_i) /(beta2+x_i);
        }

        return 0;
    }